

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O0

void * thread_pool_thread(void *threadpool)

{
  int iVar1;
  undefined8 *__ptr;
  runnable_t *task;
  thread_pool_t *pool;
  void *threadpool_local;
  
  while( true ) {
    iVar1 = sem_wait((sem_t *)((long)threadpool + 0x58));
    if (iVar1 != 0) {
      exit(-4);
    }
    iVar1 = sem_wait((sem_t *)((long)threadpool + 0x78));
    if (iVar1 != 0) break;
    if ((*(byte *)((long)threadpool + 0x18) & 1) != 0) {
      iVar1 = getQueueSize(*(Queue **)((long)threadpool + 0x10));
      if (iVar1 == 0) {
        iVar1 = sem_post((sem_t *)((long)threadpool + 0x78));
        if (iVar1 != 0) {
          exit(-4);
        }
        return threadpool_local;
      }
    }
    __ptr = (undefined8 *)dequeue(*(Queue **)((long)threadpool + 0x10));
    iVar1 = sem_post((sem_t *)((long)threadpool + 0x78));
    if (iVar1 != 0) {
      exit(-4);
    }
    (*(code *)*__ptr)(__ptr[1],__ptr[2]);
    free(__ptr);
  }
  exit(-4);
}

Assistant:

static void *thread_pool_thread(void *threadpool) {
   thread_pool_t *pool = (thread_pool_t*) threadpool;

   while(true){
       /* Waits for the task. */
       if(sem_wait(&(pool->runnables_semaphore))) {
           exit(semaphore_error);
       }

       /* Waits for permission to get the pool, when has task. */
       if(sem_wait(&(pool->pool_mutex))) {
           exit(semaphore_error);
       }

       /* Checks, if has to stop. */
       if(pool->end && getQueueSize(pool->runnables) == 0) {
           if(sem_post(&(pool->pool_mutex))){
               exit(semaphore_error);
           }
           break;
       }

       /* Deletes the task from queue. */
       runnable_t *task = dequeue(pool->runnables);

       /* Returns semaphore. */
       if(sem_post(&(pool->pool_mutex))) {
           exit(semaphore_error);
       }

       /* Run the task. */
       (*(task->function))(task->arg, task->argsz);

       free(task);
   }
}